

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_open.c
# Opt level: O1

zip_t * zip_open_from_source(zip_source_t *src,int _flags,zip_error_t *error)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  zip_error_t *error_00;
  zip_t *pzVar4;
  uint flags;
  zip_stat st;
  zip_stat_t local_68;
  
  if (src == (zip_source_t *)0x0 || _flags < 0) {
    iVar1 = 0x12;
    goto LAB_0010abb6;
  }
  uVar3 = zip_source_supports(src);
  if (zip_open_from_source::needed_support_read == -1) {
    zip_open_from_source::needed_support_read =
         zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,6,7,3,0xffffffff);
    zip_open_from_source::needed_support_write =
         zip_source_make_command_bitmap(ZIP_SOURCE_BEGIN_WRITE,9,10,0xc,0xd,0xf,0xffffffff);
  }
  if ((zip_open_from_source::needed_support_read & ~uVar3) != 0) {
    iVar1 = 0x1c;
    goto LAB_0010abb6;
  }
  flags = _flags | 0x10;
  if ((zip_open_from_source::needed_support_write & ~uVar3) == 0) {
    flags = _flags;
  }
  if ((~flags & 0x18) == 0) {
    iVar1 = 0x19;
    goto LAB_0010abb6;
  }
  zip_stat_init(&local_68);
  iVar1 = zip_source_stat(src,&local_68);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    error_00 = zip_source_error(src);
    iVar1 = zip_error_code_zip(error_00);
    if (iVar1 == 5) {
      iVar2 = zip_error_code_system(error_00);
      iVar1 = 0;
      if (iVar2 == 2) goto LAB_0010ac27;
    }
    _zip_error_copy(error,error_00);
    iVar1 = -1;
  }
LAB_0010ac27:
  if (iVar1 == -1) {
    return (zip_t *)0x0;
  }
  if (iVar1 == 0) {
    if ((flags & 1) != 0) {
      pzVar4 = _zip_allocate_new(src,flags,error);
      return pzVar4;
    }
    iVar1 = 9;
  }
  else {
    if ((flags & 2) == 0) {
      iVar1 = zip_source_open(src);
      if (iVar1 < 0) {
        _zip_error_set_from_source(error,src);
        return (zip_t *)0x0;
      }
      if ((flags & 8) == 0) {
        pzVar4 = _zip_open(src,flags,error);
      }
      else {
        pzVar4 = _zip_allocate_new(src,flags,error);
      }
      if (pzVar4 == (zip_t *)0x0) {
        zip_source_close(src);
        return (zip_t *)0x0;
      }
      return pzVar4;
    }
    iVar1 = 10;
  }
LAB_0010abb6:
  zip_error_set(error,iVar1,0);
  return (zip_t *)0x0;
}

Assistant:

ZIP_EXTERN zip_t *
zip_open_from_source(zip_source_t *src, int _flags, zip_error_t *error) {
    static zip_int64_t needed_support_read = -1;
    static zip_int64_t needed_support_write = -1;

    unsigned int flags;
    zip_int64_t supported;
    exists_t exists;

    if (_flags < 0 || src == NULL) {
	zip_error_set(error, ZIP_ER_INVAL, 0);
	return NULL;
    }
    flags = (unsigned int)_flags;

    supported = zip_source_supports(src);
    if (needed_support_read == -1) {
	needed_support_read = zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_STAT, -1);
	needed_support_write = zip_source_make_command_bitmap(ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_REMOVE, -1);
    }
    if ((supported & needed_support_read) != needed_support_read) {
	zip_error_set(error, ZIP_ER_OPNOTSUPP, 0);
	return NULL;
    }
    if ((supported & needed_support_write) != needed_support_write) {
	flags |= ZIP_RDONLY;
    }

    if ((flags & (ZIP_RDONLY | ZIP_TRUNCATE)) == (ZIP_RDONLY | ZIP_TRUNCATE)) {
	zip_error_set(error, ZIP_ER_RDONLY, 0);
	return NULL;
    }

    exists = _zip_file_exists(src, error);
    switch (exists) {
    case EXISTS_ERROR:
	return NULL;

    case EXISTS_NOT:
	if ((flags & ZIP_CREATE) == 0) {
	    zip_error_set(error, ZIP_ER_NOENT, 0);
	    return NULL;
	}
	return _zip_allocate_new(src, flags, error);

    default: {
	zip_t *za;
	if (flags & ZIP_EXCL) {
	    zip_error_set(error, ZIP_ER_EXISTS, 0);
	    return NULL;
	}
	if (zip_source_open(src) < 0) {
	    _zip_error_set_from_source(error, src);
	    return NULL;
	}

	if (flags & ZIP_TRUNCATE) {
	    za = _zip_allocate_new(src, flags, error);
	}
	else {
	    /* ZIP_CREATE gets ignored if file exists and not ZIP_EXCL, just like open() */
	    za = _zip_open(src, flags, error);
	}

	if (za == NULL) {
	    zip_source_close(src);
	    return NULL;
	}
	return za;
    }
    }
}